

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold)

{
  unsigned_long *__elements;
  int32_t in_ECX;
  istream *in_RDX;
  FastText *in_RSI;
  Meter *in_RDI;
  real in_XMM0_Da;
  Meter *this_00;
  double *__elements_2;
  Meter meter;
  undefined8 in_stack_ffffffffffffff18;
  Meter *this_01;
  Meter *in_stack_ffffffffffffffd8;
  
  this_01 = in_RDI;
  Meter::Meter(in_RDI,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
  test(in_RSI,in_RDX,in_ECX,in_XMM0_Da,in_stack_ffffffffffffffd8);
  __elements = (unsigned_long *)Meter::nexamples((Meter *)&stack0xffffffffffffff68);
  this_00 = (Meter *)Meter::precision((Meter *)0x19aef8);
  __elements_2 = (double *)Meter::recall((Meter *)0x19af16);
  std::tuple<long,_double,_double>::tuple<unsigned_long,_double,_double,_true,_true>
            ((tuple<long,_double,_double> *)this_01,__elements,(double *)this_00,__elements_2);
  Meter::~Meter(this_00);
  return (tuple<long,_double,_double> *)in_RDI;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter(false);
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}